

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O1

uint __thiscall o3dgc::Arithmetic_Codec::write_to_file(Arithmetic_Codec *this,FILE *code_file)

{
  bool bVar1;
  uint __c;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  
  uVar2 = stop_encoder(this);
  uVar5 = uVar2;
  uVar6 = uVar2;
  do {
    __c = uVar6 & 0x7f | 0x80;
    if (uVar6 < 0x80) {
      __c = uVar6 & 0x7f;
    }
    iVar3 = putc(__c,(FILE *)code_file);
    if (iVar3 == -1) goto LAB_003ae44b;
    uVar5 = uVar5 + 1;
    bVar1 = 0x7f < uVar6;
    uVar6 = uVar6 >> 7;
  } while (bVar1);
  sVar4 = fwrite(this->code_buffer,1,(ulong)uVar2,(FILE *)code_file);
  if (sVar4 == uVar2) {
    return uVar5;
  }
LAB_003ae44b:
  AC_Error("cannot write compressed data to file");
}

Assistant:

unsigned Arithmetic_Codec::write_to_file(FILE * code_file)
    {
      unsigned header_bytes = 0, code_bytes = stop_encoder(), nb = code_bytes;

                         // write variable-length header with number of code bytes
      do {
        int file_byte = int(nb & 0x7FU);
        if ((nb >>= 7) > 0) file_byte |= 0x80;
        if (putc(file_byte, code_file) == EOF)
          AC_Error("cannot write compressed data to file");
        header_bytes++;
      } while (nb);
                                                          // write compressed data
      if (fwrite(code_buffer, 1, code_bytes, code_file) != code_bytes)
        AC_Error("cannot write compressed data to file");

      return code_bytes + header_bytes;                              // bytes used
    }